

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::ContentEncAESSettings::Write(ContentEncAESSettings *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t size;
  int extraout_var;
  int extraout_var_00;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t payload;
  IMkvWriter *writer_local;
  ContentEncAESSettings *this_local;
  
  size = PayloadSize(this);
  bVar1 = WriteEbmlMasterElement(writer,0x47e7,size);
  if (bVar1) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])();
    if (extraout_var < 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = WriteEbmlElement(writer,0x47e8,this->cipher_mode_);
      if (bVar1) {
        iVar3 = (*writer->_vptr_IMkvWriter[1])();
        if ((extraout_var_00 < 0) ||
           (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) != size)) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ContentEncAESSettings::Write(IMkvWriter* writer) const {
  const uint64_t payload = PayloadSize();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncAESSettings,
                              payload))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlElement(writer, libwebm::kMkvAESSettingsCipherMode,
                        static_cast<uint64>(cipher_mode_))) {
    return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(payload))
    return false;

  return true;
}